

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  Geometry *pGVar4;
  RTCIntersectArguments *pRVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  ulong uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  byte bVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  uint uVar28;
  long lVar29;
  long lVar30;
  byte bVar31;
  ulong uVar32;
  ulong uVar33;
  byte bVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  bool bVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  float fVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined4 uVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar85 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  long lStack_2808;
  ulong *local_27e8;
  int local_279c;
  long local_2798;
  Scene *local_2790;
  long local_2788;
  RTCFilterFunctionNArguments local_2780;
  float local_2750;
  undefined4 local_274c;
  undefined4 local_2748;
  undefined4 local_2744;
  undefined4 local_2740;
  undefined4 local_273c;
  uint local_2738;
  uint local_2734;
  uint local_2730;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  uint uStack_24a4;
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  uint uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  uint uStack_23e4;
  float local_23e0 [4];
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  uint uStack_23c4;
  undefined1 local_23c0;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar44 [16];
  undefined1 auVar52 [32];
  
  local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_27e8 = local_2390;
    local_2398[0] = 0;
    aVar3 = (ray->super_RayK<1>).dir.field_0;
    auVar11 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar12 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar42._8_4_ = 0x7fffffff;
    auVar42._0_8_ = 0x7fffffff7fffffff;
    auVar42._12_4_ = 0x7fffffff;
    auVar42 = vandps_avx512vl((undefined1  [16])aVar3,auVar42);
    auVar43._8_4_ = 0x219392ef;
    auVar43._0_8_ = 0x219392ef219392ef;
    auVar43._12_4_ = 0x219392ef;
    uVar32 = vcmpps_avx512vl(auVar42,auVar43,1);
    auVar79._8_4_ = 0x3f800000;
    auVar79._0_8_ = 0x3f8000003f800000;
    auVar79._12_4_ = 0x3f800000;
    auVar42 = vdivps_avx(auVar79,(undefined1  [16])aVar3);
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar40 = (bool)((byte)uVar32 & 1);
    auVar44._0_4_ = (uint)bVar40 * auVar43._0_4_ | (uint)!bVar40 * auVar42._0_4_;
    bVar40 = (bool)((byte)(uVar32 >> 1) & 1);
    auVar44._4_4_ = (uint)bVar40 * auVar43._4_4_ | (uint)!bVar40 * auVar42._4_4_;
    bVar40 = (bool)((byte)(uVar32 >> 2) & 1);
    auVar44._8_4_ = (uint)bVar40 * auVar43._8_4_ | (uint)!bVar40 * auVar42._8_4_;
    bVar40 = (bool)((byte)(uVar32 >> 3) & 1);
    auVar44._12_4_ = (uint)bVar40 * auVar43._12_4_ | (uint)!bVar40 * auVar42._12_4_;
    auVar45._8_4_ = 0x3f7ffffa;
    auVar45._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar45._12_4_ = 0x3f7ffffa;
    auVar45 = vmulps_avx512vl(auVar44,auVar45);
    auVar46._8_4_ = 0x3f800003;
    auVar46._0_8_ = 0x3f8000033f800003;
    auVar46._12_4_ = 0x3f800003;
    auVar46 = vmulps_avx512vl(auVar44,auVar46);
    local_2680 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
    auVar97 = ZEXT3264(local_2680);
    local_26a0 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar98 = ZEXT3264(local_26a0);
    local_26c0 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    auVar99 = ZEXT3264(local_26c0);
    local_26e0 = vbroadcastss_avx512vl(auVar45);
    auVar100 = ZEXT3264(local_26e0);
    auVar42 = vmovshdup_avx(auVar45);
    local_2700 = vbroadcastsd_avx512vl(auVar42);
    auVar101 = ZEXT3264(local_2700);
    auVar48._8_4_ = 2;
    auVar48._0_8_ = 0x200000002;
    auVar48._12_4_ = 2;
    auVar48._16_4_ = 2;
    auVar48._20_4_ = 2;
    auVar48._24_4_ = 2;
    auVar48._28_4_ = 2;
    auVar43 = vshufpd_avx(auVar45,auVar45,1);
    local_2720 = vpermps_avx512vl(auVar48,ZEXT1632(auVar45));
    auVar102 = ZEXT3264(local_2720);
    fVar72 = auVar46._0_4_;
    auVar47._8_4_ = 1;
    auVar47._0_8_ = 0x100000001;
    auVar47._12_4_ = 1;
    auVar47._16_4_ = 1;
    auVar47._20_4_ = 1;
    auVar47._24_4_ = 1;
    auVar47._28_4_ = 1;
    local_25c0 = vpermps_avx2(auVar47,ZEXT1632(auVar46));
    auVar92 = ZEXT3264(local_25c0);
    local_25e0 = vpermps_avx2(auVar48,ZEXT1632(auVar46));
    auVar93 = ZEXT3264(local_25e0);
    uVar37 = (ulong)(auVar45._0_4_ < 0.0) * 0x20;
    uVar38 = (ulong)(auVar42._0_4_ < 0.0) << 5 | 0x40;
    uVar32 = (ulong)(auVar43._0_4_ < 0.0) << 5 | 0x80;
    uVar76 = auVar11._0_4_;
    local_2600._4_4_ = uVar76;
    local_2600._0_4_ = uVar76;
    local_2600._8_4_ = uVar76;
    local_2600._12_4_ = uVar76;
    local_2600._16_4_ = uVar76;
    local_2600._20_4_ = uVar76;
    local_2600._24_4_ = uVar76;
    local_2600._28_4_ = uVar76;
    auVar94 = ZEXT3264(local_2600);
    uVar76 = auVar12._0_4_;
    auVar75 = ZEXT3264(CONCAT428(uVar76,CONCAT424(uVar76,CONCAT420(uVar76,CONCAT416(uVar76,CONCAT412
                                                  (uVar76,CONCAT48(uVar76,CONCAT44(uVar76,uVar76))))
                                                  ))));
    auVar47 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar95 = ZEXT3264(auVar47);
    auVar96 = ZEXT3264(CONCAT428(0xfffffff8,
                                 CONCAT424(0xfffffff8,
                                           CONCAT420(0xfffffff8,
                                                     CONCAT416(0xfffffff8,
                                                               CONCAT412(0xfffffff8,
                                                                         CONCAT48(0xfffffff8,
                                                                                  0xfffffff8fffffff8
                                                                                 )))))));
    local_25a0 = fVar72;
    fStack_259c = fVar72;
    fStack_2598 = fVar72;
    fStack_2594 = fVar72;
    fStack_2590 = fVar72;
    fStack_258c = fVar72;
    fStack_2588 = fVar72;
    fStack_2584 = fVar72;
    fVar86 = fVar72;
    fVar87 = fVar72;
    fVar88 = fVar72;
    fVar89 = fVar72;
    fVar90 = fVar72;
    fVar91 = fVar72;
LAB_01c6b6de:
    if (local_27e8 != &local_23a0) {
      pfVar1 = (float *)(local_27e8 + -1);
      local_27e8 = local_27e8 + -2;
      if (*pfVar1 <= (ray->super_RayK<1>).tfar) {
        uVar39 = *local_27e8;
LAB_01c6b707:
        do {
          if ((uVar39 & 8) != 0) goto LAB_01c6bad4;
          auVar47 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar39 + 0x40 + uVar37),auVar97._0_32_);
          auVar47 = vmulps_avx512vl(auVar100._0_32_,auVar47);
          auVar48 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar39 + 0x40 + uVar38),auVar98._0_32_);
          auVar48 = vmulps_avx512vl(auVar101._0_32_,auVar48);
          auVar47 = vmaxps_avx(auVar47,auVar48);
          auVar48 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar39 + 0x40 + uVar32),auVar99._0_32_);
          auVar48 = vmulps_avx512vl(auVar102._0_32_,auVar48);
          auVar48 = vmaxps_avx(auVar48,auVar94._0_32_);
          auVar47 = vmaxps_avx(auVar47,auVar48);
          auVar48 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar39 + 0x40 + (uVar37 ^ 0x20)),
                                    auVar97._0_32_);
          auVar22._4_4_ = fVar86 * auVar48._4_4_;
          auVar22._0_4_ = fVar72 * auVar48._0_4_;
          auVar22._8_4_ = fVar87 * auVar48._8_4_;
          auVar22._12_4_ = fVar88 * auVar48._12_4_;
          auVar22._16_4_ = fVar89 * auVar48._16_4_;
          auVar22._20_4_ = fVar90 * auVar48._20_4_;
          auVar22._24_4_ = fVar91 * auVar48._24_4_;
          auVar22._28_4_ = auVar48._28_4_;
          auVar48 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar39 + 0x40 + (uVar38 ^ 0x20)),
                                    auVar98._0_32_);
          auVar23._4_4_ = auVar92._4_4_ * auVar48._4_4_;
          auVar23._0_4_ = auVar92._0_4_ * auVar48._0_4_;
          auVar23._8_4_ = auVar92._8_4_ * auVar48._8_4_;
          auVar23._12_4_ = auVar92._12_4_ * auVar48._12_4_;
          auVar23._16_4_ = auVar92._16_4_ * auVar48._16_4_;
          auVar23._20_4_ = auVar92._20_4_ * auVar48._20_4_;
          auVar23._24_4_ = auVar92._24_4_ * auVar48._24_4_;
          auVar23._28_4_ = auVar48._28_4_;
          auVar48 = vminps_avx(auVar22,auVar23);
          auVar49 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar39 + 0x40 + (uVar32 ^ 0x20)),
                                    auVar99._0_32_);
          auVar24._4_4_ = auVar93._4_4_ * auVar49._4_4_;
          auVar24._0_4_ = auVar93._0_4_ * auVar49._0_4_;
          auVar24._8_4_ = auVar93._8_4_ * auVar49._8_4_;
          auVar24._12_4_ = auVar93._12_4_ * auVar49._12_4_;
          auVar24._16_4_ = auVar93._16_4_ * auVar49._16_4_;
          auVar24._20_4_ = auVar93._20_4_ * auVar49._20_4_;
          auVar24._24_4_ = auVar93._24_4_ * auVar49._24_4_;
          auVar24._28_4_ = auVar49._28_4_;
          auVar49 = vminps_avx(auVar24,auVar75._0_32_);
          auVar48 = vminps_avx(auVar48,auVar49);
          uVar41 = vcmpps_avx512vl(auVar47,auVar48,2);
          bVar34 = (byte)uVar41;
          if (bVar34 == 0) break;
          auVar48 = *(undefined1 (*) [32])(uVar39 & 0xfffffffffffffff0);
          auVar49 = ((undefined1 (*) [32])(uVar39 & 0xfffffffffffffff0))[1];
          auVar50 = vpternlogd_avx512vl(auVar95._0_32_,auVar47,auVar96._0_32_,0xf8);
          auVar51 = vpcompressd_avx512vl(auVar50);
          auVar52._0_4_ =
               (uint)(bVar34 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar34 & 1) * auVar50._0_4_;
          bVar40 = (bool)((byte)(uVar41 >> 1) & 1);
          auVar52._4_4_ = (uint)bVar40 * auVar51._4_4_ | (uint)!bVar40 * auVar50._4_4_;
          bVar40 = (bool)((byte)(uVar41 >> 2) & 1);
          auVar52._8_4_ = (uint)bVar40 * auVar51._8_4_ | (uint)!bVar40 * auVar50._8_4_;
          bVar40 = (bool)((byte)(uVar41 >> 3) & 1);
          auVar52._12_4_ = (uint)bVar40 * auVar51._12_4_ | (uint)!bVar40 * auVar50._12_4_;
          bVar40 = (bool)((byte)(uVar41 >> 4) & 1);
          auVar52._16_4_ = (uint)bVar40 * auVar51._16_4_ | (uint)!bVar40 * auVar50._16_4_;
          bVar40 = (bool)((byte)(uVar41 >> 5) & 1);
          auVar52._20_4_ = (uint)bVar40 * auVar51._20_4_ | (uint)!bVar40 * auVar50._20_4_;
          bVar40 = (bool)((byte)(uVar41 >> 6) & 1);
          auVar52._24_4_ = (uint)bVar40 * auVar51._24_4_ | (uint)!bVar40 * auVar50._24_4_;
          bVar40 = SUB81(uVar41 >> 7,0);
          auVar52._28_4_ = (uint)bVar40 * auVar51._28_4_ | (uint)!bVar40 * auVar50._28_4_;
          auVar50 = vpermt2q_avx512vl(auVar48,auVar52,auVar49);
          uVar39 = auVar50._0_8_;
          bVar34 = bVar34 - 1 & bVar34;
          if (bVar34 != 0) {
            auVar50 = vpshufd_avx2(auVar52,0x55);
            vpermt2q_avx512vl(auVar48,auVar50,auVar49);
            auVar51 = vpminsd_avx2(auVar52,auVar50);
            auVar50 = vpmaxsd_avx2(auVar52,auVar50);
            bVar34 = bVar34 - 1 & bVar34;
            if (bVar34 == 0) {
              auVar51 = vpermi2q_avx512vl(auVar51,auVar48,auVar49);
              uVar39 = auVar51._0_8_;
              auVar48 = vpermt2q_avx512vl(auVar48,auVar50,auVar49);
              *local_27e8 = auVar48._0_8_;
              lVar29 = 8;
              lStack_2808 = 0x10;
            }
            else {
              auVar58 = vpshufd_avx2(auVar52,0xaa);
              vpermt2q_avx512vl(auVar48,auVar58,auVar49);
              auVar53 = vpminsd_avx2(auVar51,auVar58);
              auVar51 = vpmaxsd_avx2(auVar51,auVar58);
              auVar58 = vpminsd_avx2(auVar50,auVar51);
              auVar51 = vpmaxsd_avx2(auVar50,auVar51);
              bVar34 = bVar34 - 1 & bVar34;
              if (bVar34 == 0) {
                auVar50 = vpermi2q_avx512vl(auVar53,auVar48,auVar49);
                uVar39 = auVar50._0_8_;
                auVar50 = vpermt2q_avx512vl(auVar48,auVar51,auVar49);
                *local_27e8 = auVar50._0_8_;
                auVar50 = vpermd_avx2(auVar51,auVar47);
                *(int *)(local_27e8 + 1) = auVar50._0_4_;
                auVar48 = vpermt2q_avx512vl(auVar48,auVar58,auVar49);
                local_27e8[2] = auVar48._0_8_;
                lStack_2808 = 0x18;
                lVar29 = lStack_2808;
                lStack_2808 = 0x20;
                auVar50 = auVar58;
              }
              else {
                auVar50 = vpshufd_avx2(auVar52,0xff);
                vpermt2q_avx512vl(auVar48,auVar50,auVar49);
                auVar55 = vpminsd_avx2(auVar53,auVar50);
                auVar53 = vpmaxsd_avx2(auVar53,auVar50);
                auVar50 = vpminsd_avx2(auVar58,auVar53);
                auVar53 = vpmaxsd_avx2(auVar58,auVar53);
                auVar58 = vpminsd_avx2(auVar51,auVar53);
                auVar51 = vpmaxsd_avx2(auVar51,auVar53);
                bVar34 = bVar34 - 1 & bVar34;
                if (bVar34 != 0) {
                  auVar54 = valignd_avx512vl(auVar52,auVar52,3);
                  auVar53 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                  auVar55 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar53,auVar55);
                  auVar53 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar50 = vpermt2d_avx512vl(auVar55,auVar53,auVar50);
                  auVar53 = vpermt2d_avx512vl(auVar50,auVar53,auVar58);
                  auVar50 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar50 = vpermt2d_avx512vl(auVar53,auVar50,auVar51);
                  auVar97 = ZEXT3264(auVar50);
                  bVar31 = bVar34;
                  do {
                    auVar51 = auVar97._0_32_;
                    auVar80._8_4_ = 1;
                    auVar80._0_8_ = 0x100000001;
                    auVar80._12_4_ = 1;
                    auVar80._16_4_ = 1;
                    auVar80._20_4_ = 1;
                    auVar80._24_4_ = 1;
                    auVar80._28_4_ = 1;
                    auVar50 = vpermd_avx2(auVar80,auVar54);
                    auVar54 = valignd_avx512vl(auVar54,auVar54,1);
                    vpermt2q_avx512vl(auVar48,auVar54,auVar49);
                    bVar31 = bVar31 - 1 & bVar31;
                    uVar16 = vpcmpd_avx512vl(auVar50,auVar51,5);
                    auVar50 = vpmaxsd_avx2(auVar50,auVar51);
                    bVar17 = (byte)uVar16 << 1;
                    auVar51 = valignd_avx512vl(auVar51,auVar51,7);
                    bVar40 = (bool)((byte)uVar16 & 1);
                    bVar6 = (bool)(bVar17 >> 2 & 1);
                    bVar7 = (bool)(bVar17 >> 3 & 1);
                    bVar8 = (bool)(bVar17 >> 4 & 1);
                    bVar9 = (bool)(bVar17 >> 5 & 1);
                    bVar10 = (bool)(bVar17 >> 6 & 1);
                    auVar97 = ZEXT3264(CONCAT428((uint)(bVar17 >> 7) * auVar51._28_4_ |
                                                 (uint)!(bool)(bVar17 >> 7) * auVar50._28_4_,
                                                 CONCAT424((uint)bVar10 * auVar51._24_4_ |
                                                           (uint)!bVar10 * auVar50._24_4_,
                                                           CONCAT420((uint)bVar9 * auVar51._20_4_ |
                                                                     (uint)!bVar9 * auVar50._20_4_,
                                                                     CONCAT416((uint)bVar8 *
                                                                               auVar51._16_4_ |
                                                                               (uint)!bVar8 *
                                                                               auVar50._16_4_,
                                                                               CONCAT412((uint)bVar7
                                                                                         * auVar51.
                                                  _12_4_ | (uint)!bVar7 * auVar50._12_4_,
                                                  CONCAT48((uint)bVar6 * auVar51._8_4_ |
                                                           (uint)!bVar6 * auVar50._8_4_,
                                                           CONCAT44((uint)bVar40 * auVar51._4_4_ |
                                                                    (uint)!bVar40 * auVar50._4_4_,
                                                                    auVar50._0_4_))))))));
                  } while (bVar31 != 0);
                  lVar29 = (ulong)(uint)POPCOUNT((uint)bVar34) + 3;
                  while( true ) {
                    auVar51 = auVar97._0_32_;
                    auVar50 = vpermt2q_avx512vl(auVar48,auVar51,auVar49);
                    uVar39 = auVar50._0_8_;
                    bVar40 = lVar29 == 0;
                    lVar29 = lVar29 + -1;
                    if (bVar40) break;
                    *local_27e8 = uVar39;
                    auVar50 = vpermd_avx2(auVar51,auVar47);
                    *(int *)(local_27e8 + 1) = auVar50._0_4_;
                    auVar50 = valignd_avx512vl(auVar51,auVar51,1);
                    auVar97 = ZEXT3264(auVar50);
                    local_27e8 = local_27e8 + 2;
                  }
                  auVar97 = ZEXT3264(local_2680);
                  auVar98 = ZEXT3264(local_26a0);
                  auVar99 = ZEXT3264(local_26c0);
                  auVar100 = ZEXT3264(local_26e0);
                  auVar101 = ZEXT3264(local_2700);
                  auVar102 = ZEXT3264(local_2720);
                  goto LAB_01c6b707;
                }
                auVar53 = vpermi2q_avx512vl(auVar55,auVar48,auVar49);
                uVar39 = auVar53._0_8_;
                auVar53 = vpermt2q_avx512vl(auVar48,auVar51,auVar49);
                *local_27e8 = auVar53._0_8_;
                auVar51 = vpermd_avx2(auVar51,auVar47);
                *(int *)(local_27e8 + 1) = auVar51._0_4_;
                auVar51 = vpermt2q_avx512vl(auVar48,auVar58,auVar49);
                local_27e8[2] = auVar51._0_8_;
                auVar51 = vpermd_avx2(auVar58,auVar47);
                *(int *)(local_27e8 + 3) = auVar51._0_4_;
                auVar48 = vpermt2q_avx512vl(auVar48,auVar50,auVar49);
                local_27e8[4] = auVar48._0_8_;
                lVar29 = 0x28;
                lStack_2808 = 0x30;
              }
            }
            auVar47 = vpermd_avx2(auVar50,auVar47);
            *(int *)((long)local_27e8 + lVar29) = auVar47._0_4_;
            local_27e8 = (ulong *)((long)local_27e8 + lStack_2808);
          }
        } while( true );
      }
      goto LAB_01c6b6de;
    }
  }
  return;
LAB_01c6bad4:
  local_2798 = (ulong)((uint)uVar39 & 0xf) - 8;
  uVar39 = uVar39 & 0xfffffffffffffff0;
  for (local_2788 = 0; local_2788 != local_2798; local_2788 = local_2788 + 1) {
    lVar30 = local_2788 * 0xe0;
    lVar29 = uVar39 + 0xd0 + lVar30;
    local_2620 = *(undefined8 *)(lVar29 + 0x10);
    uStack_2618 = *(undefined8 *)(lVar29 + 0x18);
    lVar29 = uVar39 + 0xc0 + lVar30;
    local_2580 = *(undefined8 *)(lVar29 + 0x10);
    uStack_2578 = *(undefined8 *)(lVar29 + 0x18);
    uStack_2570 = local_2580;
    uStack_2568 = uStack_2578;
    uStack_2610 = local_2620;
    uStack_2608 = uStack_2618;
    auVar56._16_16_ = *(undefined1 (*) [16])(uVar39 + 0x60 + lVar30);
    auVar56._0_16_ = *(undefined1 (*) [16])(uVar39 + lVar30);
    auVar57._16_16_ = *(undefined1 (*) [16])(uVar39 + 0x70 + lVar30);
    auVar57._0_16_ = *(undefined1 (*) [16])(uVar39 + 0x10 + lVar30);
    auVar61._16_16_ = *(undefined1 (*) [16])(uVar39 + 0x80 + lVar30);
    auVar61._0_16_ = *(undefined1 (*) [16])(uVar39 + 0x20 + lVar30);
    auVar42 = *(undefined1 (*) [16])(uVar39 + 0x30 + lVar30);
    auVar62._16_16_ = auVar42;
    auVar62._0_16_ = auVar42;
    auVar42 = *(undefined1 (*) [16])(uVar39 + 0x40 + lVar30);
    auVar63._16_16_ = auVar42;
    auVar63._0_16_ = auVar42;
    auVar42 = *(undefined1 (*) [16])(uVar39 + 0x50 + lVar30);
    auVar64._16_16_ = auVar42;
    auVar64._0_16_ = auVar42;
    auVar42 = *(undefined1 (*) [16])(uVar39 + 0x90 + lVar30);
    auVar65._16_16_ = auVar42;
    auVar65._0_16_ = auVar42;
    auVar42 = *(undefined1 (*) [16])(uVar39 + 0xa0 + lVar30);
    auVar66._16_16_ = auVar42;
    auVar66._0_16_ = auVar42;
    auVar42 = *(undefined1 (*) [16])(uVar39 + 0xb0 + lVar30);
    auVar67._16_16_ = auVar42;
    auVar67._0_16_ = auVar42;
    uVar76 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    auVar69._4_4_ = uVar76;
    auVar69._0_4_ = uVar76;
    auVar69._8_4_ = uVar76;
    auVar69._12_4_ = uVar76;
    auVar69._16_4_ = uVar76;
    auVar69._20_4_ = uVar76;
    auVar69._24_4_ = uVar76;
    auVar69._28_4_ = uVar76;
    auVar49 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar50 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    uVar76 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    auVar81._4_4_ = uVar76;
    auVar81._0_4_ = uVar76;
    auVar81._8_4_ = uVar76;
    auVar81._12_4_ = uVar76;
    auVar81._16_4_ = uVar76;
    auVar81._20_4_ = uVar76;
    auVar81._24_4_ = uVar76;
    auVar81._28_4_ = uVar76;
    uVar76 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    auVar83._4_4_ = uVar76;
    auVar83._0_4_ = uVar76;
    auVar83._8_4_ = uVar76;
    auVar83._12_4_ = uVar76;
    auVar83._16_4_ = uVar76;
    auVar83._20_4_ = uVar76;
    auVar83._24_4_ = uVar76;
    auVar83._28_4_ = uVar76;
    fVar86 = (ray->super_RayK<1>).dir.field_0.m128[2];
    auVar85._4_4_ = fVar86;
    auVar85._0_4_ = fVar86;
    auVar85._8_4_ = fVar86;
    auVar85._12_4_ = fVar86;
    auVar85._16_4_ = fVar86;
    auVar85._20_4_ = fVar86;
    auVar85._24_4_ = fVar86;
    auVar85._28_4_ = fVar86;
    auVar47 = vsubps_avx(auVar56,auVar69);
    auVar56 = vsubps_avx512vl(auVar57,auVar49);
    auVar57 = vsubps_avx512vl(auVar61,auVar50);
    auVar51 = vsubps_avx512vl(auVar62,auVar69);
    auVar53 = vsubps_avx512vl(auVar63,auVar49);
    auVar58 = vsubps_avx512vl(auVar64,auVar50);
    auVar48 = vsubps_avx(auVar65,auVar69);
    auVar59 = vsubps_avx512vl(auVar66,auVar49);
    auVar60 = vsubps_avx512vl(auVar67,auVar50);
    auVar49 = vsubps_avx(auVar48,auVar47);
    auVar61 = vsubps_avx512vl(auVar59,auVar56);
    auVar50 = vsubps_avx(auVar60,auVar57);
    auVar62 = vsubps_avx512vl(auVar47,auVar51);
    auVar63 = vsubps_avx512vl(auVar56,auVar53);
    auVar64 = vsubps_avx512vl(auVar57,auVar58);
    auVar65 = vsubps_avx512vl(auVar51,auVar48);
    auVar66 = vsubps_avx512vl(auVar53,auVar59);
    auVar67 = vsubps_avx512vl(auVar58,auVar60);
    auVar77._0_4_ = auVar48._0_4_ + auVar47._0_4_;
    auVar77._4_4_ = auVar48._4_4_ + auVar47._4_4_;
    auVar77._8_4_ = auVar48._8_4_ + auVar47._8_4_;
    auVar77._12_4_ = auVar48._12_4_ + auVar47._12_4_;
    auVar77._16_4_ = auVar48._16_4_ + auVar47._16_4_;
    auVar77._20_4_ = auVar48._20_4_ + auVar47._20_4_;
    auVar77._24_4_ = auVar48._24_4_ + auVar47._24_4_;
    auVar77._28_4_ = auVar48._28_4_ + auVar47._28_4_;
    auVar54 = vaddps_avx512vl(auVar59,auVar56);
    auVar55 = vaddps_avx512vl(auVar60,auVar57);
    auVar68 = vmulps_avx512vl(auVar54,auVar50);
    auVar68 = vfmsub231ps_avx512vl(auVar68,auVar61,auVar55);
    auVar55 = vmulps_avx512vl(auVar55,auVar49);
    auVar69 = vfmsub231ps_avx512vl(auVar55,auVar50,auVar77);
    auVar55._4_4_ = auVar61._4_4_ * auVar77._4_4_;
    auVar55._0_4_ = auVar61._0_4_ * auVar77._0_4_;
    auVar55._8_4_ = auVar61._8_4_ * auVar77._8_4_;
    auVar55._12_4_ = auVar61._12_4_ * auVar77._12_4_;
    auVar55._16_4_ = auVar61._16_4_ * auVar77._16_4_;
    auVar55._20_4_ = auVar61._20_4_ * auVar77._20_4_;
    auVar55._24_4_ = auVar61._24_4_ * auVar77._24_4_;
    auVar55._28_4_ = auVar77._28_4_;
    auVar42 = vfmsub231ps_fma(auVar55,auVar49,auVar54);
    auVar78._0_4_ = fVar86 * auVar42._0_4_;
    auVar78._4_4_ = fVar86 * auVar42._4_4_;
    auVar78._8_4_ = fVar86 * auVar42._8_4_;
    auVar78._12_4_ = fVar86 * auVar42._12_4_;
    auVar78._16_4_ = fVar86 * 0.0;
    auVar78._20_4_ = fVar86 * 0.0;
    auVar78._24_4_ = fVar86 * 0.0;
    auVar78._28_4_ = 0;
    auVar55 = vfmadd231ps_avx512vl(auVar78,auVar83,auVar69);
    local_2560 = vfmadd231ps_avx512vl(auVar55,auVar81,auVar68);
    auVar55 = vaddps_avx512vl(auVar47,auVar51);
    auVar54 = vaddps_avx512vl(auVar56,auVar53);
    auVar68 = vaddps_avx512vl(auVar57,auVar58);
    auVar69 = vmulps_avx512vl(auVar54,auVar64);
    auVar69 = vfmsub231ps_avx512vl(auVar69,auVar63,auVar68);
    auVar68 = vmulps_avx512vl(auVar68,auVar62);
    auVar68 = vfmsub231ps_avx512vl(auVar68,auVar64,auVar55);
    auVar55 = vmulps_avx512vl(auVar55,auVar63);
    auVar55 = vfmsub231ps_avx512vl(auVar55,auVar62,auVar54);
    auVar54._4_4_ = fVar86 * auVar55._4_4_;
    auVar54._0_4_ = fVar86 * auVar55._0_4_;
    auVar54._8_4_ = fVar86 * auVar55._8_4_;
    auVar54._12_4_ = fVar86 * auVar55._12_4_;
    auVar54._16_4_ = fVar86 * auVar55._16_4_;
    auVar54._20_4_ = fVar86 * auVar55._20_4_;
    auVar54._24_4_ = fVar86 * auVar55._24_4_;
    auVar54._28_4_ = auVar55._28_4_;
    auVar55 = vfmadd231ps_avx512vl(auVar54,auVar83,auVar68);
    local_2540 = vfmadd231ps_avx512vl(auVar55,auVar81,auVar69);
    auVar48 = vaddps_avx512vl(auVar51,auVar48);
    auVar51 = vaddps_avx512vl(auVar53,auVar59);
    auVar53 = vaddps_avx512vl(auVar58,auVar60);
    auVar58 = vmulps_avx512vl(auVar51,auVar67);
    auVar58 = vfmsub231ps_avx512vl(auVar58,auVar66,auVar53);
    auVar59._4_4_ = auVar53._4_4_ * auVar65._4_4_;
    auVar59._0_4_ = auVar53._0_4_ * auVar65._0_4_;
    auVar59._8_4_ = auVar53._8_4_ * auVar65._8_4_;
    auVar59._12_4_ = auVar53._12_4_ * auVar65._12_4_;
    auVar59._16_4_ = auVar53._16_4_ * auVar65._16_4_;
    auVar59._20_4_ = auVar53._20_4_ * auVar65._20_4_;
    auVar59._24_4_ = auVar53._24_4_ * auVar65._24_4_;
    auVar59._28_4_ = auVar53._28_4_;
    auVar42 = vfmsub231ps_fma(auVar59,auVar67,auVar48);
    auVar60._4_4_ = auVar48._4_4_ * auVar66._4_4_;
    auVar60._0_4_ = auVar48._0_4_ * auVar66._0_4_;
    auVar60._8_4_ = auVar48._8_4_ * auVar66._8_4_;
    auVar60._12_4_ = auVar48._12_4_ * auVar66._12_4_;
    auVar60._16_4_ = auVar48._16_4_ * auVar66._16_4_;
    auVar60._20_4_ = auVar48._20_4_ * auVar66._20_4_;
    auVar60._24_4_ = auVar48._24_4_ * auVar66._24_4_;
    auVar60._28_4_ = auVar48._28_4_;
    auVar48 = vfmsub231ps_avx512vl(auVar60,auVar65,auVar51);
    auVar48 = vmulps_avx512vl(auVar85,auVar48);
    auVar48 = vfmadd231ps_avx512vl(auVar48,auVar83,ZEXT1632(auVar42));
    auVar48 = vfmadd231ps_avx512vl(auVar48,auVar81,auVar58);
    auVar68._0_4_ = local_2560._0_4_ + local_2540._0_4_;
    auVar68._4_4_ = local_2560._4_4_ + local_2540._4_4_;
    auVar68._8_4_ = local_2560._8_4_ + local_2540._8_4_;
    auVar68._12_4_ = local_2560._12_4_ + local_2540._12_4_;
    auVar68._16_4_ = local_2560._16_4_ + local_2540._16_4_;
    auVar68._20_4_ = local_2560._20_4_ + local_2540._20_4_;
    auVar68._24_4_ = local_2560._24_4_ + local_2540._24_4_;
    auVar68._28_4_ = local_2560._28_4_ + local_2540._28_4_;
    local_2520 = vaddps_avx512vl(auVar48,auVar68);
    auVar51._8_4_ = 0x7fffffff;
    auVar51._0_8_ = 0x7fffffff7fffffff;
    auVar51._12_4_ = 0x7fffffff;
    auVar51._16_4_ = 0x7fffffff;
    auVar51._20_4_ = 0x7fffffff;
    auVar51._24_4_ = 0x7fffffff;
    auVar51._28_4_ = 0x7fffffff;
    vandps_avx512vl(local_2520,auVar51);
    auVar53._8_4_ = 0x34000000;
    auVar53._0_8_ = 0x3400000034000000;
    auVar53._12_4_ = 0x34000000;
    auVar53._16_4_ = 0x34000000;
    auVar53._20_4_ = 0x34000000;
    auVar53._24_4_ = 0x34000000;
    auVar53._28_4_ = 0x34000000;
    auVar51 = vmulps_avx512vl(local_2520,auVar53);
    auVar53 = vminps_avx512vl(local_2560,local_2540);
    auVar53 = vminps_avx512vl(auVar53,auVar48);
    auVar58._8_4_ = 0x80000000;
    auVar58._0_8_ = 0x8000000080000000;
    auVar58._12_4_ = 0x80000000;
    auVar58._16_4_ = 0x80000000;
    auVar58._20_4_ = 0x80000000;
    auVar58._24_4_ = 0x80000000;
    auVar58._28_4_ = 0x80000000;
    auVar58 = vxorps_avx512vl(auVar51,auVar58);
    uVar16 = vcmpps_avx512vl(auVar53,auVar58,5);
    auVar53 = vmaxps_avx512vl(local_2560,local_2540);
    auVar48 = vmaxps_avx512vl(auVar53,auVar48);
    uVar13 = vcmpps_avx512vl(auVar48,auVar51,2);
    local_24a0 = (byte)uVar16 | (byte)uVar13;
    if (local_24a0 != 0) {
      auVar48 = vmulps_avx512vl(auVar50,auVar63);
      auVar51 = vmulps_avx512vl(auVar49,auVar64);
      auVar53 = vmulps_avx512vl(auVar61,auVar62);
      auVar58 = vmulps_avx512vl(auVar64,auVar66);
      auVar55 = vmulps_avx512vl(auVar62,auVar67);
      auVar54 = vmulps_avx512vl(auVar63,auVar65);
      auVar59 = vfmsub213ps_avx512vl(auVar61,auVar64,auVar48);
      auVar50 = vfmsub213ps_avx512vl(auVar50,auVar62,auVar51);
      auVar49 = vfmsub213ps_avx512vl(auVar49,auVar63,auVar53);
      auVar60 = vfmsub213ps_avx512vl(auVar67,auVar63,auVar58);
      auVar61 = vfmsub213ps_avx512vl(auVar65,auVar64,auVar55);
      auVar62 = vfmsub213ps_avx512vl(auVar66,auVar62,auVar54);
      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar48,auVar63);
      vandps_avx512vl(auVar58,auVar63);
      uVar41 = vcmpps_avx512vl(auVar63,auVar63,1);
      vandps_avx512vl(auVar51,auVar63);
      vandps_avx512vl(auVar55,auVar63);
      uVar33 = vcmpps_avx512vl(auVar63,auVar63,1);
      vandps_avx512vl(auVar53,auVar63);
      vandps_avx512vl(auVar54,auVar63);
      uVar14 = vcmpps_avx512vl(auVar63,auVar63,1);
      bVar40 = (bool)((byte)uVar41 & 1);
      local_2500._0_4_ = (float)((uint)bVar40 * auVar59._0_4_ | (uint)!bVar40 * auVar60._0_4_);
      bVar40 = (bool)((byte)(uVar41 >> 1) & 1);
      local_2500._4_4_ = (float)((uint)bVar40 * auVar59._4_4_ | (uint)!bVar40 * auVar60._4_4_);
      bVar40 = (bool)((byte)(uVar41 >> 2) & 1);
      local_2500._8_4_ = (float)((uint)bVar40 * auVar59._8_4_ | (uint)!bVar40 * auVar60._8_4_);
      bVar40 = (bool)((byte)(uVar41 >> 3) & 1);
      local_2500._12_4_ = (float)((uint)bVar40 * auVar59._12_4_ | (uint)!bVar40 * auVar60._12_4_);
      bVar40 = (bool)((byte)(uVar41 >> 4) & 1);
      local_2500._16_4_ = (float)((uint)bVar40 * auVar59._16_4_ | (uint)!bVar40 * auVar60._16_4_);
      bVar40 = (bool)((byte)(uVar41 >> 5) & 1);
      local_2500._20_4_ = (float)((uint)bVar40 * auVar59._20_4_ | (uint)!bVar40 * auVar60._20_4_);
      bVar40 = (bool)((byte)(uVar41 >> 6) & 1);
      local_2500._24_4_ = (float)((uint)bVar40 * auVar59._24_4_ | (uint)!bVar40 * auVar60._24_4_);
      bVar40 = SUB81(uVar41 >> 7,0);
      local_2500._28_4_ = (uint)bVar40 * auVar59._28_4_ | (uint)!bVar40 * auVar60._28_4_;
      bVar40 = (bool)((byte)uVar33 & 1);
      local_24e0._0_4_ = (float)((uint)bVar40 * auVar50._0_4_ | (uint)!bVar40 * auVar61._0_4_);
      bVar40 = (bool)((byte)(uVar33 >> 1) & 1);
      local_24e0._4_4_ = (float)((uint)bVar40 * auVar50._4_4_ | (uint)!bVar40 * auVar61._4_4_);
      bVar40 = (bool)((byte)(uVar33 >> 2) & 1);
      local_24e0._8_4_ = (float)((uint)bVar40 * auVar50._8_4_ | (uint)!bVar40 * auVar61._8_4_);
      bVar40 = (bool)((byte)(uVar33 >> 3) & 1);
      local_24e0._12_4_ = (float)((uint)bVar40 * auVar50._12_4_ | (uint)!bVar40 * auVar61._12_4_);
      bVar40 = (bool)((byte)(uVar33 >> 4) & 1);
      local_24e0._16_4_ = (float)((uint)bVar40 * auVar50._16_4_ | (uint)!bVar40 * auVar61._16_4_);
      bVar40 = (bool)((byte)(uVar33 >> 5) & 1);
      local_24e0._20_4_ = (float)((uint)bVar40 * auVar50._20_4_ | (uint)!bVar40 * auVar61._20_4_);
      bVar40 = (bool)((byte)(uVar33 >> 6) & 1);
      local_24e0._24_4_ = (float)((uint)bVar40 * auVar50._24_4_ | (uint)!bVar40 * auVar61._24_4_);
      bVar40 = SUB81(uVar33 >> 7,0);
      local_24e0._28_4_ = (uint)bVar40 * auVar50._28_4_ | (uint)!bVar40 * auVar61._28_4_;
      bVar40 = (bool)((byte)uVar14 & 1);
      local_24c0 = (float)((uint)bVar40 * auVar49._0_4_ | (uint)!bVar40 * auVar62._0_4_);
      bVar40 = (bool)((byte)(uVar14 >> 1) & 1);
      fStack_24bc = (float)((uint)bVar40 * auVar49._4_4_ | (uint)!bVar40 * auVar62._4_4_);
      bVar40 = (bool)((byte)(uVar14 >> 2) & 1);
      fStack_24b8 = (float)((uint)bVar40 * auVar49._8_4_ | (uint)!bVar40 * auVar62._8_4_);
      bVar40 = (bool)((byte)(uVar14 >> 3) & 1);
      fStack_24b4 = (float)((uint)bVar40 * auVar49._12_4_ | (uint)!bVar40 * auVar62._12_4_);
      bVar40 = (bool)((byte)(uVar14 >> 4) & 1);
      fStack_24b0 = (float)((uint)bVar40 * auVar49._16_4_ | (uint)!bVar40 * auVar62._16_4_);
      bVar40 = (bool)((byte)(uVar14 >> 5) & 1);
      fStack_24ac = (float)((uint)bVar40 * auVar49._20_4_ | (uint)!bVar40 * auVar62._20_4_);
      bVar40 = (bool)((byte)(uVar14 >> 6) & 1);
      fStack_24a8 = (float)((uint)bVar40 * auVar49._24_4_ | (uint)!bVar40 * auVar62._24_4_);
      bVar40 = SUB81(uVar14 >> 7,0);
      uStack_24a4 = (uint)bVar40 * auVar49._28_4_ | (uint)!bVar40 * auVar62._28_4_;
      auVar25._4_4_ = fVar86 * fStack_24bc;
      auVar25._0_4_ = fVar86 * local_24c0;
      auVar25._8_4_ = fVar86 * fStack_24b8;
      auVar25._12_4_ = fVar86 * fStack_24b4;
      auVar25._16_4_ = fVar86 * fStack_24b0;
      auVar25._20_4_ = fVar86 * fStack_24ac;
      auVar25._24_4_ = fVar86 * fStack_24a8;
      auVar25._28_4_ = fVar86;
      auVar42 = vfmadd213ps_fma(auVar83,local_24e0,auVar25);
      auVar42 = vfmadd213ps_fma(auVar81,local_2500,ZEXT1632(auVar42));
      auVar51 = ZEXT1632(CONCAT412(auVar42._12_4_ + auVar42._12_4_,
                                   CONCAT48(auVar42._8_4_ + auVar42._8_4_,
                                            CONCAT44(auVar42._4_4_ + auVar42._4_4_,
                                                     auVar42._0_4_ + auVar42._0_4_))));
      auVar84._0_4_ = auVar57._0_4_ * local_24c0;
      auVar84._4_4_ = auVar57._4_4_ * fStack_24bc;
      auVar84._8_4_ = auVar57._8_4_ * fStack_24b8;
      auVar84._12_4_ = auVar57._12_4_ * fStack_24b4;
      auVar84._16_4_ = auVar57._16_4_ * fStack_24b0;
      auVar84._20_4_ = auVar57._20_4_ * fStack_24ac;
      auVar84._24_4_ = auVar57._24_4_ * fStack_24a8;
      auVar84._28_4_ = 0;
      auVar42 = vfmadd213ps_fma(auVar56,local_24e0,auVar84);
      auVar11 = vfmadd213ps_fma(auVar47,local_2500,ZEXT1632(auVar42));
      auVar47 = vrcp14ps_avx512vl(auVar51);
      auVar49._8_4_ = 0x3f800000;
      auVar49._0_8_ = 0x3f8000003f800000;
      auVar49._12_4_ = 0x3f800000;
      auVar49._16_4_ = 0x3f800000;
      auVar49._20_4_ = 0x3f800000;
      auVar49._24_4_ = 0x3f800000;
      auVar49._28_4_ = 0x3f800000;
      auVar48 = vfnmadd213ps_avx512vl(auVar47,auVar51,auVar49);
      auVar42 = vfmadd132ps_fma(auVar48,auVar47,auVar47);
      local_2440 = ZEXT1632(CONCAT412(auVar42._12_4_ * (auVar11._12_4_ + auVar11._12_4_),
                                      CONCAT48(auVar42._8_4_ * (auVar11._8_4_ + auVar11._8_4_),
                                               CONCAT44(auVar42._4_4_ *
                                                        (auVar11._4_4_ + auVar11._4_4_),
                                                        auVar42._0_4_ *
                                                        (auVar11._0_4_ + auVar11._0_4_)))));
      auVar75 = ZEXT3264(local_2440);
      uVar76 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      auVar50._4_4_ = uVar76;
      auVar50._0_4_ = uVar76;
      auVar50._8_4_ = uVar76;
      auVar50._12_4_ = uVar76;
      auVar50._16_4_ = uVar76;
      auVar50._20_4_ = uVar76;
      auVar50._24_4_ = uVar76;
      auVar50._28_4_ = uVar76;
      uVar16 = vcmpps_avx512vl(local_2440,auVar50,0xd);
      auVar18._8_4_ = 0x80000000;
      auVar18._0_8_ = 0x8000000080000000;
      auVar18._12_4_ = 0x80000000;
      auVar18._16_4_ = 0x80000000;
      auVar18._20_4_ = 0x80000000;
      auVar18._24_4_ = 0x80000000;
      auVar18._28_4_ = 0x80000000;
      auVar47 = vxorps_avx512vl(auVar51,auVar18);
      fVar86 = (ray->super_RayK<1>).tfar;
      auVar19._4_4_ = fVar86;
      auVar19._0_4_ = fVar86;
      auVar19._8_4_ = fVar86;
      auVar19._12_4_ = fVar86;
      auVar19._16_4_ = fVar86;
      auVar19._20_4_ = fVar86;
      auVar19._24_4_ = fVar86;
      auVar19._28_4_ = fVar86;
      uVar13 = vcmpps_avx512vl(local_2440,auVar19,2);
      uVar15 = vcmpps_avx512vl(auVar51,auVar47,4);
      local_24a0 = (byte)uVar16 & (byte)uVar13 & (byte)uVar15 & local_24a0;
      uVar41 = (ulong)local_24a0;
      if (local_24a0 != 0) {
        auVar47 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
        auVar92 = ZEXT3264(auVar47);
        uVar28 = vextractps_avx(auVar47._0_16_,1);
        local_23c0 = 0xf0;
        auVar20._8_4_ = 0x219392ef;
        auVar20._0_8_ = 0x219392ef219392ef;
        auVar20._12_4_ = 0x219392ef;
        auVar20._16_4_ = 0x219392ef;
        auVar20._20_4_ = 0x219392ef;
        auVar20._24_4_ = 0x219392ef;
        auVar20._28_4_ = 0x219392ef;
        uVar33 = vcmpps_avx512vl(local_2520,auVar20,5);
        auVar48 = vrcp14ps_avx512vl(local_2520);
        auVar82._8_4_ = 0x3f800000;
        auVar82._0_8_ = 0x3f8000003f800000;
        auVar82._12_4_ = 0x3f800000;
        auVar82._16_4_ = 0x3f800000;
        auVar82._20_4_ = 0x3f800000;
        auVar82._24_4_ = 0x3f800000;
        auVar82._28_4_ = 0x3f800000;
        auVar42 = vfnmadd213ps_fma(local_2520,auVar48,auVar82);
        auVar47 = vfmadd132ps_avx512vl(ZEXT1632(auVar42),auVar48,auVar48);
        fVar87 = (float)((uint)((byte)uVar33 & 1) * auVar47._0_4_);
        fVar86 = (float)((uint)((byte)(uVar33 >> 1) & 1) * auVar47._4_4_);
        fVar88 = (float)((uint)((byte)(uVar33 >> 2) & 1) * auVar47._8_4_);
        fVar89 = (float)((uint)((byte)(uVar33 >> 3) & 1) * auVar47._12_4_);
        fVar72 = (float)((uint)((byte)(uVar33 >> 4) & 1) * auVar47._16_4_);
        fVar91 = (float)((uint)((byte)(uVar33 >> 5) & 1) * auVar47._20_4_);
        fVar90 = (float)((uint)((byte)(uVar33 >> 6) & 1) * auVar47._24_4_);
        auVar26._4_4_ = fVar86 * local_2560._4_4_;
        auVar26._0_4_ = fVar87 * local_2560._0_4_;
        auVar26._8_4_ = fVar88 * local_2560._8_4_;
        auVar26._12_4_ = fVar89 * local_2560._12_4_;
        auVar26._16_4_ = fVar72 * local_2560._16_4_;
        auVar26._20_4_ = fVar91 * local_2560._20_4_;
        auVar26._24_4_ = fVar90 * local_2560._24_4_;
        auVar26._28_4_ = local_2560._28_4_;
        auVar47 = vminps_avx(auVar26,auVar82);
        auVar27._4_4_ = fVar86 * local_2540._4_4_;
        auVar27._0_4_ = fVar87 * local_2540._0_4_;
        auVar27._8_4_ = fVar88 * local_2540._8_4_;
        auVar27._12_4_ = fVar89 * local_2540._12_4_;
        auVar27._16_4_ = fVar72 * local_2540._16_4_;
        auVar27._20_4_ = fVar91 * local_2540._20_4_;
        auVar27._24_4_ = fVar90 * local_2540._24_4_;
        auVar27._28_4_ = auVar48._28_4_;
        auVar48 = vminps_avx(auVar27,auVar82);
        auVar49 = vsubps_avx(auVar82,auVar47);
        auVar50 = vsubps_avx(auVar82,auVar48);
        local_2460 = vblendps_avx(auVar48,auVar49,0xf0);
        local_2480 = vblendps_avx(auVar47,auVar50,0xf0);
        fVar86 = (float)DAT_01fbac00;
        fVar87 = DAT_01fbac00._4_4_;
        fVar88 = DAT_01fbac00._8_4_;
        fVar89 = DAT_01fbac00._12_4_;
        fVar90 = DAT_01fbac00._16_4_;
        fVar91 = DAT_01fbac00._20_4_;
        fVar72 = DAT_01fbac00._24_4_;
        local_2420[0] = local_2500._0_4_ * fVar86;
        local_2420[1] = local_2500._4_4_ * fVar87;
        local_2420[2] = local_2500._8_4_ * fVar88;
        local_2420[3] = local_2500._12_4_ * fVar89;
        fStack_2410 = local_2500._16_4_ * fVar90;
        fStack_240c = local_2500._20_4_ * fVar91;
        fStack_2408 = local_2500._24_4_ * fVar72;
        uStack_2404 = local_2500._28_4_;
        local_2400[0] = local_24e0._0_4_ * fVar86;
        local_2400[1] = local_24e0._4_4_ * fVar87;
        local_2400[2] = local_24e0._8_4_ * fVar88;
        local_2400[3] = local_24e0._12_4_ * fVar89;
        fStack_23f0 = local_24e0._16_4_ * fVar90;
        fStack_23ec = local_24e0._20_4_ * fVar91;
        fStack_23e8 = local_24e0._24_4_ * fVar72;
        uStack_23e4 = local_24e0._28_4_;
        local_23e0[0] = local_24c0 * fVar86;
        local_23e0[1] = fStack_24bc * fVar87;
        local_23e0[2] = fStack_24b8 * fVar88;
        local_23e0[3] = fStack_24b4 * fVar89;
        fStack_23d0 = fStack_24b0 * fVar90;
        fStack_23cc = fStack_24ac * fVar91;
        fStack_23c8 = fStack_24a8 * fVar72;
        uStack_23c4 = uStack_24a4;
        auVar73._8_4_ = 0x7f800000;
        auVar73._0_8_ = 0x7f8000007f800000;
        auVar73._12_4_ = 0x7f800000;
        auVar73._16_4_ = 0x7f800000;
        auVar73._20_4_ = 0x7f800000;
        auVar73._24_4_ = 0x7f800000;
        auVar73._28_4_ = 0x7f800000;
        auVar47 = vblendmps_avx512vl(auVar73,local_2440);
        auVar70._0_4_ =
             (uint)(local_24a0 & 1) * auVar47._0_4_ | (uint)!(bool)(local_24a0 & 1) * 0x7f800000;
        bVar40 = (bool)(local_24a0 >> 1 & 1);
        auVar70._4_4_ = (uint)bVar40 * auVar47._4_4_ | (uint)!bVar40 * 0x7f800000;
        bVar40 = (bool)(local_24a0 >> 2 & 1);
        auVar70._8_4_ = (uint)bVar40 * auVar47._8_4_ | (uint)!bVar40 * 0x7f800000;
        bVar40 = (bool)(local_24a0 >> 3 & 1);
        auVar70._12_4_ = (uint)bVar40 * auVar47._12_4_ | (uint)!bVar40 * 0x7f800000;
        bVar40 = (bool)(local_24a0 >> 4 & 1);
        auVar70._16_4_ = (uint)bVar40 * auVar47._16_4_ | (uint)!bVar40 * 0x7f800000;
        bVar40 = (bool)(local_24a0 >> 5 & 1);
        auVar70._20_4_ = (uint)bVar40 * auVar47._20_4_ | (uint)!bVar40 * 0x7f800000;
        bVar40 = (bool)(local_24a0 >> 6 & 1);
        auVar70._24_4_ = (uint)bVar40 * auVar47._24_4_ | (uint)!bVar40 * 0x7f800000;
        auVar70._28_4_ =
             (uint)(local_24a0 >> 7) * auVar47._28_4_ | (uint)!(bool)(local_24a0 >> 7) * 0x7f800000;
        auVar47 = vshufps_avx(auVar70,auVar70,0xb1);
        auVar47 = vminps_avx(auVar70,auVar47);
        auVar48 = vshufpd_avx(auVar47,auVar47,5);
        auVar47 = vminps_avx(auVar47,auVar48);
        auVar48 = vpermpd_avx2(auVar47,0x4e);
        auVar47 = vminps_avx(auVar47,auVar48);
        uVar16 = vcmpps_avx512vl(auVar70,auVar47,0);
        bVar34 = local_24a0;
        if (((byte)uVar16 & local_24a0) != 0) {
          bVar34 = (byte)uVar16 & local_24a0;
        }
        uVar35 = 0;
        for (uVar36 = (uint)bVar34; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x80000000) {
          uVar35 = uVar35 + 1;
        }
        local_2790 = context->scene;
        do {
          uVar36 = uVar35 & 0xff;
          local_2738 = *(uint *)((long)&local_2580 + (ulong)uVar36 * 4);
          pGVar4 = (local_2790->geometries).items[local_2738].ptr;
          if ((pGVar4->mask & uVar28) == 0) {
            uVar41 = (ulong)(byte)(~(byte)(1 << (uVar35 & 0x1f)) & (byte)uVar41);
          }
          else {
            pRVar5 = context->args;
            local_2660 = auVar92._0_32_;
            if (pRVar5->filter == (RTCFilterFunctionN)0x0) {
              local_2780.context = context->user;
              if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                uVar41 = (ulong)(uVar36 << 2);
                fVar86 = *(float *)(local_2480 + uVar41);
                fVar87 = *(float *)(local_2460 + uVar41);
                (ray->super_RayK<1>).tfar = *(float *)(local_2440 + uVar41);
                (ray->Ng).field_0.field_0.x = *(float *)((long)local_2420 + uVar41);
                (ray->Ng).field_0.field_0.y = *(float *)((long)local_2400 + uVar41);
                (ray->Ng).field_0.field_0.z = *(float *)((long)local_23e0 + uVar41);
                ray->u = fVar86;
                ray->v = fVar87;
                ray->primID = *(uint *)((long)&local_2620 + uVar41);
                ray->geomID = local_2738;
                ray->instID[0] = (local_2780.context)->instID[0];
                ray->instPrimID[0] = (local_2780.context)->instPrimID[0];
                break;
              }
            }
            else {
              local_2780.context = context->user;
            }
            uVar33 = (ulong)(uVar36 * 4);
            local_2750 = *(float *)((long)local_2420 + uVar33);
            local_274c = *(undefined4 *)((long)local_2400 + uVar33);
            local_2748 = *(undefined4 *)((long)local_23e0 + uVar33);
            local_2744 = *(undefined4 *)(local_2480 + uVar33);
            local_2740 = *(undefined4 *)(local_2460 + uVar33);
            local_273c = *(undefined4 *)((long)&local_2620 + uVar33);
            local_2734 = (local_2780.context)->instID[0];
            local_2730 = (local_2780.context)->instPrimID[0];
            (ray->super_RayK<1>).tfar = *(float *)(local_2440 + uVar33);
            local_279c = -1;
            local_2780.valid = &local_279c;
            local_2780.geometryUserPtr = pGVar4->userPtr;
            local_2780.ray = (RTCRayN *)ray;
            local_2780.hit = (RTCHitN *)&local_2750;
            local_2780.N = 1;
            local_2640 = auVar75._0_32_;
            if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c6c1d0:
              if ((pRVar5->filter != (RTCFilterFunctionN)0x0) &&
                 (((pRVar5->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                (*pRVar5->filter)(&local_2780);
                auVar75 = ZEXT3264(local_2640);
                auVar102 = ZEXT3264(local_2720);
                auVar101 = ZEXT3264(local_2700);
                auVar100 = ZEXT3264(local_26e0);
                auVar99 = ZEXT3264(local_26c0);
                auVar98 = ZEXT3264(local_26a0);
                auVar97 = ZEXT3264(local_2680);
                if (*local_2780.valid == 0) goto LAB_01c6c2be;
              }
              (((Vec3f *)((long)local_2780.ray + 0x30))->field_0).field_0.x =
                   *(float *)local_2780.hit;
              (((Vec3f *)((long)local_2780.ray + 0x30))->field_0).field_0.y =
                   *(float *)(local_2780.hit + 4);
              (((Vec3f *)((long)local_2780.ray + 0x30))->field_0).field_0.z =
                   *(float *)(local_2780.hit + 8);
              *(float *)((long)local_2780.ray + 0x3c) = *(float *)(local_2780.hit + 0xc);
              *(float *)((long)local_2780.ray + 0x40) = *(float *)(local_2780.hit + 0x10);
              *(float *)((long)local_2780.ray + 0x44) = *(float *)(local_2780.hit + 0x14);
              *(float *)((long)local_2780.ray + 0x48) = *(float *)(local_2780.hit + 0x18);
              *(float *)((long)local_2780.ray + 0x4c) = *(float *)(local_2780.hit + 0x1c);
              *(float *)((long)local_2780.ray + 0x50) = *(float *)(local_2780.hit + 0x20);
            }
            else {
              (*pGVar4->intersectionFilterN)(&local_2780);
              auVar75 = ZEXT3264(local_2640);
              auVar102 = ZEXT3264(local_2720);
              auVar101 = ZEXT3264(local_2700);
              auVar100 = ZEXT3264(local_26e0);
              auVar99 = ZEXT3264(local_26c0);
              auVar98 = ZEXT3264(local_26a0);
              auVar97 = ZEXT3264(local_2680);
              if (*local_2780.valid != 0) goto LAB_01c6c1d0;
LAB_01c6c2be:
              (ray->super_RayK<1>).tfar = (float)local_2660._0_4_;
            }
            fVar86 = (ray->super_RayK<1>).tfar;
            auVar21._4_4_ = fVar86;
            auVar21._0_4_ = fVar86;
            auVar21._8_4_ = fVar86;
            auVar21._12_4_ = fVar86;
            auVar21._16_4_ = fVar86;
            auVar21._20_4_ = fVar86;
            auVar21._24_4_ = fVar86;
            auVar21._28_4_ = fVar86;
            uVar33 = vcmpps_avx512vl(auVar75._0_32_,auVar21,2);
            uVar41 = (byte)(~(byte)(1 << (uVar35 & 0x1f)) & (byte)uVar41) & uVar33;
            uVar28 = (ray->super_RayK<1>).mask;
            auVar92 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
          }
          bVar34 = (byte)uVar41;
          if (bVar34 == 0) break;
          auVar74._8_4_ = 0x7f800000;
          auVar74._0_8_ = 0x7f8000007f800000;
          auVar74._12_4_ = 0x7f800000;
          auVar74._16_4_ = 0x7f800000;
          auVar74._20_4_ = 0x7f800000;
          auVar74._24_4_ = 0x7f800000;
          auVar74._28_4_ = 0x7f800000;
          auVar47 = vblendmps_avx512vl(auVar74,auVar75._0_32_);
          auVar71._0_4_ =
               (uint)(bVar34 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar34 & 1) * 0x7f800000;
          bVar40 = (bool)((byte)(uVar41 >> 1) & 1);
          auVar71._4_4_ = (uint)bVar40 * auVar47._4_4_ | (uint)!bVar40 * 0x7f800000;
          bVar40 = (bool)((byte)(uVar41 >> 2) & 1);
          auVar71._8_4_ = (uint)bVar40 * auVar47._8_4_ | (uint)!bVar40 * 0x7f800000;
          bVar40 = (bool)((byte)(uVar41 >> 3) & 1);
          auVar71._12_4_ = (uint)bVar40 * auVar47._12_4_ | (uint)!bVar40 * 0x7f800000;
          bVar40 = (bool)((byte)(uVar41 >> 4) & 1);
          auVar71._16_4_ = (uint)bVar40 * auVar47._16_4_ | (uint)!bVar40 * 0x7f800000;
          bVar40 = (bool)((byte)(uVar41 >> 5) & 1);
          auVar71._20_4_ = (uint)bVar40 * auVar47._20_4_ | (uint)!bVar40 * 0x7f800000;
          bVar40 = (bool)((byte)(uVar41 >> 6) & 1);
          auVar71._24_4_ = (uint)bVar40 * auVar47._24_4_ | (uint)!bVar40 * 0x7f800000;
          bVar40 = SUB81(uVar41 >> 7,0);
          auVar71._28_4_ = (uint)bVar40 * auVar47._28_4_ | (uint)!bVar40 * 0x7f800000;
          auVar47 = vshufps_avx(auVar71,auVar71,0xb1);
          auVar47 = vminps_avx(auVar71,auVar47);
          auVar48 = vshufpd_avx(auVar47,auVar47,5);
          auVar47 = vminps_avx(auVar47,auVar48);
          auVar48 = vpermpd_avx2(auVar47,0x4e);
          auVar47 = vminps_avx(auVar47,auVar48);
          uVar16 = vcmpps_avx512vl(auVar71,auVar47,0);
          bVar34 = (byte)uVar16 & bVar34;
          uVar36 = (uint)uVar41;
          if (bVar34 != 0) {
            uVar36 = (uint)bVar34;
          }
          uVar35 = 0;
          for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x80000000) {
            uVar35 = uVar35 + 1;
          }
        } while( true );
      }
    }
    auVar92 = ZEXT3264(local_25c0);
    auVar93 = ZEXT3264(local_25e0);
    auVar94 = ZEXT3264(local_2600);
    fVar72 = local_25a0;
    fVar86 = fStack_259c;
    fVar87 = fStack_2598;
    fVar88 = fStack_2594;
    fVar89 = fStack_2590;
    fVar90 = fStack_258c;
    fVar91 = fStack_2588;
  }
  fVar2 = (ray->super_RayK<1>).tfar;
  auVar75 = ZEXT3264(CONCAT428(fVar2,CONCAT424(fVar2,CONCAT420(fVar2,CONCAT416(fVar2,CONCAT412(fVar2
                                                  ,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))))))));
  auVar47 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar95 = ZEXT3264(auVar47);
  auVar96 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  goto LAB_01c6b6de;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }